

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O3

void iemgui_do_drawmove(void *x,t_iemgui *iemgui)

{
  _iemgui_private *p_Var1;
  int iVar2;
  int iVar3;
  
  iVar2 = glist_isvisible(iemgui->x_glist);
  if (iVar2 != 0) {
    iVar2 = text_xpix(&iemgui->x_obj,iemgui->x_glist);
    iVar3 = text_ypix(&iemgui->x_obj,iemgui->x_glist);
    (*iemgui->x_draw)(x,iemgui->x_glist,1);
    p_Var1 = iemgui->x_private;
    p_Var1->p_prevX = iVar2;
    p_Var1->p_prevY = iVar3;
    canvas_fixlinesfor(iemgui->x_glist,(t_text *)x);
    return;
  }
  return;
}

Assistant:

static void iemgui_do_drawmove(void *x, t_iemgui*iemgui)
{
    if(glist_isvisible(iemgui->x_glist))
    {
        int xpos = text_xpix(&iemgui->x_obj, iemgui->x_glist);
        int ypos = text_ypix(&iemgui->x_obj, iemgui->x_glist);
        (*iemgui->x_draw)(x, iemgui->x_glist, IEM_GUI_DRAW_MODE_MOVE);
        iemgui->x_private->p_prevX = xpos;
        iemgui->x_private->p_prevY = ypos;
        canvas_fixlinesfor(iemgui->x_glist, (t_text*)x);
    }
}